

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O3

void cff_builder_add_point(CFF_Builder *builder,FT_Pos x,FT_Pos y,FT_Byte flag)

{
  short sVar1;
  FT_Outline *pFVar2;
  FT_Vector *pFVar3;
  char *pcVar4;
  
  pFVar2 = builder->current;
  if (builder->load_points != '\0') {
    sVar1 = pFVar2->n_points;
    pFVar3 = pFVar2->points;
    pcVar4 = pFVar2->tags;
    pFVar3[sVar1].x = x >> 10;
    pFVar3[sVar1].y = y >> 10;
    pcVar4[sVar1] = (flag == '\0') + '\x01';
  }
  pFVar2->n_points = pFVar2->n_points + 1;
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  cff_builder_add_point( CFF_Builder*  builder,
                         FT_Pos        x,
                         FT_Pos        y,
                         FT_Byte       flag )
  {
    FT_Outline*  outline = builder->current;


    if ( builder->load_points )
    {
      FT_Vector*  point   = outline->points + outline->n_points;
      FT_Byte*    control = (FT_Byte*)outline->tags + outline->n_points;

#ifdef CFF_CONFIG_OPTION_OLD_ENGINE
      PS_Driver  driver   = (PS_Driver)FT_FACE_DRIVER( builder->face );


      if ( driver->hinting_engine == FT_HINTING_FREETYPE )
      {
        point->x = x >> 16;
        point->y = y >> 16;
      }
      else
#endif
      {
        /* cf2_decoder_parse_charstrings uses 16.16 coordinates */
        point->x = x >> 10;
        point->y = y >> 10;
      }
      *control = (FT_Byte)( flag ? FT_CURVE_TAG_ON : FT_CURVE_TAG_CUBIC );
    }

    outline->n_points++;
  }